

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::TweakSpeeds(APlayerPawn *this,double *forward,double *side)

{
  AInventory *this_00;
  double dVar1;
  double dVar2;
  
  if ((this->super_AActor).health <= this->RunHealth) {
    dVar1 = *forward;
    dVar2 = 6400.0;
    if (dVar1 <= 6400.0) {
      dVar2 = dVar1;
    }
    *forward = (double)(~-(ulong)(-6400.0 < dVar1) & 0xc0b9000000000000 |
                       (ulong)dVar2 & -(ulong)(-6400.0 < dVar1));
    dVar1 = *side;
    dVar2 = 6144.0;
    if (dVar1 <= 6144.0) {
      dVar2 = dVar1;
    }
    *side = (double)(~-(ulong)(-6144.0 < dVar1) & 0xc0b8000000000000 |
                    (ulong)dVar2 & -(ulong)(-6144.0 < dVar1));
  }
  *forward = *forward * (&this->ForwardMove1)[12800.0 <= ABS(*forward)];
  *side = *side * (&this->SideMove1)[10240.0 <= ABS(*side)];
  if ((((this->super_AActor).player)->morphTics == 0) &&
     (this_00 = (this->super_AActor).Inventory.field_0.p, this_00 != (AInventory *)0x0)) {
    if (((this_00->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      dVar1 = AInventory::GetSpeedFactor(this_00);
      *forward = *forward * dVar1;
      *side = dVar1 * *side;
    }
    else {
      (this->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void APlayerPawn::TweakSpeeds (double &forward, double &side)
{
	// Strife's player can't run when its health is below 10
	if (health <= RunHealth)
	{
		forward = clamp<double>(forward, -0x1900, 0x1900);
		side = clamp<double>(side, -0x1800, 0x1800);
	}

	// [GRB]
	if (fabs(forward) < 0x3200)
	{
		forward *= ForwardMove1;
	}
	else
	{
		forward *= ForwardMove2;
	}

	if (fabs(side) < 0x2800)
	{
		side *= SideMove1;
	}
	else
	{
		side *= SideMove2;
	}

	if (!player->morphTics && Inventory != NULL)
	{
		double factor = Inventory->GetSpeedFactor ();
		forward *= factor;
		side *= factor;
	}
}